

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

string * __thiscall
s2textformat::ToString_abi_cxx11_
          (string *__return_storage_ptr__,s2textformat *this,S2PointLoopSpan loop)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (loop.super_S2PointSpan.ptr_ == (pointer)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"full","",loop.super_S2PointSpan.len_);
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    AppendVertices((S2Point *)this,(int)loop.super_S2PointSpan.ptr_,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString(S2PointLoopSpan loop) {
  // S2Shape represents the full loop as a loop with no vertices.
  // There is no representation of the empty loop.
  if (loop.empty()) {
    return "full";
  }
  string out;
  AppendVertices(loop.data(), loop.size(), &out);
  return out;
}